

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O0

int LoadBuildInfo(TCascStorage *hs)

{
  int iVar1;
  code *pcStack_18;
  int nError;
  PARSEINFOFILE PfnParseProc;
  TCascStorage *hs_local;
  
  pcStack_18 = (PARSEINFOFILE)0x0;
  if (hs->BuildFileType == CascBuildInfo) {
    pcStack_18 = ParseFile_BuildInfo;
  }
  else if (hs->BuildFileType == CascBuildDb) {
    pcStack_18 = ParseFile_BuildDb;
  }
  iVar1 = LoadTextFile(hs,pcStack_18);
  return iVar1;
}

Assistant:

int LoadBuildInfo(TCascStorage * hs)
{
    PARSEINFOFILE PfnParseProc = NULL;
    int nError = ERROR_NOT_SUPPORTED;

    // We support either ".build.info" or ".build.db"
    switch (hs->BuildFileType)
    {
        case CascBuildInfo:
            PfnParseProc = ParseFile_BuildInfo;
            break;

        case CascBuildDb:
            PfnParseProc = ParseFile_BuildDb;
            break;

        default:
            nError = ERROR_NOT_SUPPORTED;
            break;
    }

    return LoadTextFile(hs, PfnParseProc);
}